

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

int FFSinternal_decode(FFSTypeHandle_conflict ioformat,char *src,void *dest,int to_buffer)

{
  FFSContext p_Var1;
  FMFormat_conflict p_Var2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  ssize_t sVar7;
  ssize_t sVar8;
  char *__src;
  long lVar9;
  char *__dest;
  size_t __n;
  _FFSBuffer *buf;
  ulong uVar10;
  ulong size;
  long input_record_len;
  char *__dest_00;
  char *final_string_base;
  char *__src_00;
  IOConversionStruct *conv;
  void *local_158;
  int record_len;
  undefined4 uStack_114;
  ssize_t local_110;
  IOConversionStruct null_conv;
  
  p_Var1 = ioformat->context;
  iVar4 = FFSheader_size(ioformat);
  conv = ioformat->conversion;
  if (conv == (IOConversionPtr_conflict)0x0) {
    conv = &null_conv;
    null_conv.conversion_type = none_required;
    null_conv.max_var_expansion = 1.0;
    null_conv.conv_count = 0;
    null_conv.base_size_delta = 0;
    null_conv.context = p_Var1;
    null_conv.ioformat = ioformat;
    null_conv.native_field_list = (FMFieldList)0x0;
  }
  else if (p_Var1 != conv->context) {
    fwrite("IOFile and conversion mismatch\n",0x1f,1,_stderr);
    return -1;
  }
  p_Var2 = ioformat->body;
  if (p_Var2->variant == 0) {
    input_record_len = (long)p_Var2->record_length;
  }
  else if (p_Var2->IOversion < 4) {
    iVar5 = (p_Var2->server_ID).length;
    _record_len = CONCAT44(uStack_114,*(int *)(src + (ulong)(-iVar5 & 3) + (long)iVar5));
    iVar5 = *(int *)(src + (ulong)(-iVar5 & 3) + (long)iVar5);
    if (p_Var2->byte_reversal != 0) {
      byte_swap((char *)&record_len,4);
      iVar5 = record_len;
    }
    input_record_len = (long)iVar5;
  }
  else {
    _record_len = *(int64_t *)(src + (p_Var2->server_ID).length);
    input_record_len = _record_len;
    if (p_Var2->byte_reversal != 0) {
      byte_swap((char *)&record_len,8);
      input_record_len = _record_len;
    }
  }
  iVar5 = p_Var2->record_length;
  sVar3 = conv->base_size_delta;
  uVar10 = (ulong)(int)(iVar5 + 7U & 0xfffffff8);
  iVar6 = final_variant_size_for_record(input_record_len,conv);
  buf = &p_Var1->tmp;
  make_tmp_buffer(buf,0);
  sVar7 = 0;
  if (dest == (void *)0x0) {
    size = (long)iVar5 + sVar3 + 7 & 0xfffffffffffffff8;
    if (size <= uVar10) {
      size = uVar10;
    }
    sVar7 = add_to_tmp_buffer(buf,size);
    if (sVar7 == -1) {
      return 0;
    }
  }
  __src_00 = src + (int)((-iVar4 & 7U) + iVar4);
  __dest_00 = (char *)dest;
  sVar8 = sVar7;
  if (direct_to_mem < conv->conversion_type) {
    if ((src == (char *)0x0) || (__src_00 == (char *)dest)) {
      sVar8 = add_to_tmp_buffer(buf,(long)(int)(ioformat->body->record_length + 7U & 0xfffffff8));
      if (sVar8 == -1) {
        return 0;
      }
      __dest_00 = (char *)0x0;
    }
    else {
      sVar8 = 0;
      __dest_00 = __src_00;
    }
  }
  iVar4 = ioformat->body->record_length;
  local_110 = sVar7;
  if (dest == (void *)0x0 || to_buffer == 0) {
    lVar9 = input_record_len - uVar10;
    if ((long)(input_record_len - uVar10) < iVar6) {
      lVar9 = iVar6;
    }
    sVar7 = add_to_tmp_buffer(buf,lVar9 + (ulong)(-iVar4 & 7) + 7 & 0xfffffffffffffff8);
    if (sVar7 == -1) {
      return 0;
    }
    final_string_base = (char *)0x0;
  }
  else {
    final_string_base =
         (char *)(((long)iVar4 + conv->base_size_delta + 7 & 0xfffffffffffffff8) + (long)dest);
    sVar7 = 0;
  }
  __src = __src_00 + (ulong)(-iVar5 & 7) + (long)iVar5;
  iVar4 = in_place_variant_conversion_possible(conv);
  lVar9 = sVar7;
  __dest = final_string_base;
  if (iVar4 == 0) {
    if ((src == (char *)0x0) || (__src_00 == (char *)dest)) {
      lVar9 = add_to_tmp_buffer(buf,(input_record_len - ioformat->body->record_length) + 8);
      if (lVar9 == -1) {
        return 0;
      }
      __dest = (char *)0x0;
    }
    else {
      lVar9 = 0;
      __dest = __src;
    }
  }
  local_158 = dest;
  if (dest == (void *)0x0) {
    local_158 = (void *)(local_110 + (long)buf->tmp_buffer);
  }
  if (__dest_00 == (char *)0x0) {
    __dest_00 = (char *)(sVar8 + (long)buf->tmp_buffer);
  }
  if (final_string_base == (char *)0x0) {
    final_string_base = (char *)(sVar7 + (long)buf->tmp_buffer);
  }
  if (__dest == (char *)0x0) {
    __dest = (char *)(lVar9 + (long)buf->tmp_buffer);
  }
  if (__dest_00 != __src_00) {
    memcpy(__dest_00,__src_00,(long)ioformat->body->record_length);
  }
  if ((__dest != __src) &&
     (__n = input_record_len - ((ulong)(-iVar5 & 7) + (long)ioformat->body->record_length),
     0 < (long)__n)) {
    memcpy(__dest,__src,__n);
  }
  if (conv->conversion_type != none_required) {
    FFSconvert_record(conv,__dest_00,local_158,final_string_base,__dest);
  }
  return 1;
}

Assistant:

static int
FFSinternal_decode(FFSTypeHandle ioformat, char *src, void *dest, int to_buffer)
{
    FFSContext iofile = ioformat->context;
    IOConversionPtr conv;
    int64_t input_record_len;
    IOConversionStruct null_conv;
    int align_pad;
    int header_size = FFSheader_size(ioformat);
    int data_align_pad;
    conversion_action params;

    conv = ioformat->conversion;

    if (conv == NULL) {
	null_conv.conversion_type = none_required;
	null_conv.max_var_expansion = 1.0;
	null_conv.conv_count = 0;
	null_conv.base_size_delta = 0;
	null_conv.context = iofile;
	null_conv.ioformat = ioformat;
	null_conv.native_field_list = NULL;
	conv = &null_conv;
    }
    if (iofile != conv->context) {
	fprintf(stderr, "IOFile and conversion mismatch\n");
	return -1;
    }
    if (ioformat == NULL)
	return 0;

    if (ioformat->body->variant) {
	if (ioformat->body->IOversion <= 3) {
	    FILE_INT record_len;
	    int len_align_pad = (4 - ioformat->body->server_ID.length) & 3;
	    FILE_INT *len_ptr = (FILE_INT *) (src + ioformat->body->server_ID.length +
					      len_align_pad);
	    memcpy(&record_len, len_ptr, 4);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 4);
	    input_record_len = record_len;
	} else {
	    uint64_t record_len;
	    uint64_t *len_ptr = (uint64_t *) (src + ioformat->body->server_ID.length);
	    memcpy(&record_len, len_ptr, 8);
	    if (ioformat->body->byte_reversal)
		byte_swap((char *) &record_len, 8);
	    input_record_len = record_len;
	}
    } else {
	input_record_len = ioformat->body->record_length;
    }
    align_pad = (8 - header_size) & 0x7;
    header_size += align_pad;
    data_align_pad = (8 - ioformat->body->record_length) & 0x7;

    params.cur_base = src + header_size;
    params.cur_variant = params.cur_base + ioformat->body->record_length +
	data_align_pad;
    params.final_base = dest;
    params.variant_with_base = to_buffer;
    if (!set_conversion_params(ioformat, input_record_len, conv, &params))
	return 0;

    /* update stats 
    iofile->stats.decode_bytes += input_record_len;
    iofile->stats.decode_msg_count++;*/

    if (params.src_address != params.cur_base) {
	memcpy(params.src_address, params.cur_base, ioformat->body->record_length);
    }
    if (params.src_string_address != params.cur_variant) {
	if (input_record_len - ioformat->body->record_length - data_align_pad > 0) {
	    memcpy(params.src_string_address, params.cur_variant,
		   input_record_len - ioformat->body->record_length - data_align_pad);
	}
    }
    if (conv->conversion_type != none_required) {
	FFSconvert_record(conv, params.src_address, params.dest_address,
			 params.final_string_address,
			 params.src_string_address);
    }
    return 1;
}